

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O3

int curl_strequal(char *first,char *second)

{
  int iVar1;
  
  iVar1 = strcasecmp(first,second);
  return (int)(iVar1 == 0);
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
#if defined(HAVE_STRCASECMP)
  return !(strcasecmp)(first, second);
#elif defined(HAVE_STRCMPI)
  return !(strcmpi)(first, second);
#elif defined(HAVE_STRICMP)
  return !(stricmp)(first, second);
#else
  while(*first && *second) {
    if(toupper(*first) != toupper(*second)) {
      break;
    }
    first++;
    second++;
  }
  return toupper(*first) == toupper(*second);
#endif
}